

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Pos_index PVar5;
  pointer puVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ID_index IVar10;
  Column_dimension_option CVar11;
  ID_index IVar12;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pCVar13;
  bool bVar14;
  Pos_index PVar15;
  Pos_index PVar16;
  Index IVar17;
  pointer p;
  long *plVar18;
  invalid_argument *this_00;
  const_iterator __end0;
  long *plVar19;
  long lVar20;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *pIVar21;
  ulong uVar22;
  anon_class_1_0_00000001 local_54;
  anon_class_1_0_00000001 local_53;
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  long local_50;
  Index local_44;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  *local_40;
  anon_class_8_1_e4bd5e45 local_38;
  
  puVar6 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar20 = (ulong)columnIndex1 * 0x30;
  uVar2 = *(uint *)(lVar7 + 4 + lVar20);
  local_50 = (ulong)columnIndex2 * 0x30;
  uVar3 = puVar6[uVar2];
  uVar4 = puVar6[*(uint *)(lVar7 + 4 + local_50)];
  iVar8 = uVar3 - uVar4;
  if (uVar3 < uVar4) {
    iVar8 = -(uVar3 - uVar4);
  }
  local_44 = columnIndex2;
  if (iVar8 != 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,
               "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the \'real\' matrix."
              );
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_40 = this;
  PVar15 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
           ::death(&this->super_type,uVar2);
  lVar9 = (ulong)columnIndex2 * 0x30;
  uVar2 = *(uint *)((long)local_40[1].super_type.
                          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                          .barcode_.
                          super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4 + lVar9);
  PVar5 = (local_40->super_type).pivotToPosition_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2];
  PVar16 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
           ::death(&local_40->super_type,uVar2);
  pCVar13 = local_40;
  lVar7 = (long)local_40[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)(lVar7 + 4 + lVar20);
  plVar19 = (long *)(lVar7 + lVar9 + 0x20);
  if ((PVar15 == uVar3) && (plVar18 = plVar19, PVar16 == PVar5)) {
    while (plVar18 = (long *)*plVar18, plVar18 != plVar19) {
      if (plVar18 == (long *)0x0) {
LAB_0016636c:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, false>>::Matrix_column_tag, Type = 1]"
                     );
      }
      if (*(uint *)(plVar18 + 2) == uVar2) {
        IVar17 = _negative_vine_swap(local_40,columnIndex1,local_44);
        return IVar17;
      }
    }
    uVar3 = *(uint *)(lVar7 + 4 + local_50);
    uVar22 = (ulong)uVar3;
    Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
    ::negative_transpose(&local_40->super_type,uVar2,uVar3);
  }
  else {
    plVar18 = plVar19;
    if (PVar15 == uVar3) {
      while (plVar18 = (long *)*plVar18, plVar18 != plVar19) {
        if (plVar18 == (long *)0x0) goto LAB_0016636c;
        if (*(uint *)(plVar18 + 2) == uVar2) {
          pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                    *)(lVar7 + lVar20);
          pIVar21 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                     *)(lVar7 + local_50);
          local_38.targetColumn = pIVar1;
          bVar14 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                             (pIVar21,pIVar1,&local_51,&local_38,&local_52,&local_53,&local_54);
          if (bVar14) {
            CVar11.dim_ = (pIVar1->super_Column_dimension_option).dim_;
            IVar12 = (pIVar1->super_Chain_column_option).pivot_;
            IVar10 = (pIVar21->super_Chain_column_option).pivot_;
            pIVar1->super_Column_dimension_option =
                 (Column_dimension_option)(pIVar21->super_Column_dimension_option).dim_;
            (pIVar1->super_Chain_column_option).pivot_ = IVar10;
            pIVar21->super_Column_dimension_option = (Column_dimension_option)CVar11.dim_;
            (pIVar21->super_Chain_column_option).pivot_ = IVar12;
          }
          uVar3 = (pIVar1->super_Chain_column_option).pivot_;
          if (uVar2 != uVar3) {
            puVar6 = local_40[1].super_type.
                     super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                     .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar4 = puVar6[uVar2];
            puVar6[uVar2] = puVar6[uVar3];
            puVar6[uVar3] = uVar4;
          }
          puVar6 = (local_40->super_type).pivotToPosition_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)local_40[1].super_type.
                        super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                        .barcode_.
                        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          uVar2 = *(uint *)(lVar7 + 4 + lVar20);
          uVar3 = *(uint *)(lVar7 + 4 + local_50);
          uVar4 = puVar6[uVar2];
          puVar6[uVar2] = puVar6[uVar3];
          puVar6[uVar3] = uVar4;
          return local_44;
        }
      }
      uVar3 = *(uint *)(lVar7 + 4 + local_50);
      uVar22 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::negative_positive_transpose(&local_40->super_type,uVar2,uVar3);
    }
    else if (PVar16 == PVar5) {
      while (plVar18 = (long *)*plVar18, plVar18 != plVar19) {
        if (plVar18 == (long *)0x0) goto LAB_0016636c;
        if (*(uint *)(plVar18 + 2) == uVar2) {
          pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                    *)(lVar7 + local_50);
          uVar2 = *(uint *)(lVar7 + 4 + local_50);
          pIVar21 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                     *)(lVar7 + lVar20);
          local_38.targetColumn = pIVar1;
          bVar14 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_c___ersistence_matrix::Column_types)7,false,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                             (pIVar21,pIVar1,&local_51,&local_38,&local_52,&local_53,&local_54);
          pCVar13 = local_40;
          if (bVar14) {
            CVar11.dim_ = (pIVar1->super_Column_dimension_option).dim_;
            IVar12 = (pIVar1->super_Chain_column_option).pivot_;
            IVar10 = (pIVar21->super_Chain_column_option).pivot_;
            pIVar1->super_Column_dimension_option =
                 (Column_dimension_option)(pIVar21->super_Column_dimension_option).dim_;
            (pIVar1->super_Chain_column_option).pivot_ = IVar10;
            pIVar21->super_Column_dimension_option = (Column_dimension_option)CVar11.dim_;
            (pIVar21->super_Chain_column_option).pivot_ = IVar12;
          }
          uVar3 = (pIVar1->super_Chain_column_option).pivot_;
          if (uVar2 != uVar3) {
            puVar6 = local_40[1].super_type.
                     super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                     .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar4 = puVar6[uVar2];
            puVar6[uVar2] = puVar6[uVar3];
            puVar6[uVar3] = uVar4;
          }
          lVar7 = (long)local_40[1].super_type.
                        super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                        .barcode_.
                        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          uVar2 = *(uint *)(lVar7 + 4 + lVar20);
          uVar3 = *(uint *)(lVar7 + 4 + local_50);
          Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
          ::positive_negative_transpose(&local_40->super_type,uVar2,uVar3);
          puVar6 = (pCVar13->super_type).pivotToPosition_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = puVar6[uVar2];
          puVar6[uVar2] = puVar6[uVar3];
          puVar6[uVar3] = uVar4;
          return columnIndex1;
        }
      }
      uVar3 = *(uint *)(lVar7 + 4 + local_50);
      uVar22 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_negative_transpose(&local_40->super_type,uVar2,uVar3);
    }
    else {
      while (plVar18 = (long *)*plVar18, plVar18 != plVar19) {
        if (plVar18 == (long *)0x0) goto LAB_0016636c;
        if (*(uint *)(plVar18 + 2) == uVar2) {
          IVar17 = _positive_vine_swap(local_40,columnIndex1,local_44);
          return IVar17;
        }
      }
      uVar3 = *(uint *)(lVar7 + 4 + local_50);
      uVar22 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      ::positive_transpose(&local_40->super_type,uVar2,uVar3);
    }
  }
  puVar6 = (pCVar13->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = puVar6[uVar2];
  puVar6[uVar2] = puVar6[uVar22];
  puVar6[uVar22] = uVar3;
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}